

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::shapeSliceLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  uint uVar1;
  Type *pTVar2;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar3;
  runtime_error *prVar4;
  int iVar5;
  undefined1 *from;
  uint uVar6;
  ShapeRange outrange;
  ShapeRange size;
  ShapeRange local_a0;
  ShapeRange local_80;
  SliceLayerParams slice;
  
  pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->input_).super_RepeatedPtrFieldBase,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar2);
  pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar2);
  pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  ShapeConstraint::setName(this_01,pTVar2);
  pSVar3 = ShapeConstraint::sequenceRange(this_00);
  ShapeConstraint::updateSequenceRange(this_01,pSVar3);
  pSVar3 = ShapeConstraint::batchRange(this_00);
  ShapeConstraint::updateBatchRange(this_01,pSVar3);
  pSVar3 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar3);
  pSVar3 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar3);
  if (specLayer->_oneof_case_[0] == 0x15e) {
    from = *(undefined1 **)&specLayer->layer_;
  }
  else {
    from = Specification::_SliceLayerParams_default_instance_;
  }
  Specification::SliceLayerParams::SliceLayerParams(&slice,(SliceLayerParams *)from);
  uVar6 = (uint)slice.endindex_;
  if ((int)(uint)slice.startindex_ < 0 || (int)(uint)slice.endindex_ < 1) {
    if (0 < (int)(uint)slice.endindex_ || -1 < (int)(uint)slice.startindex_) {
      ShapeRange::ShapeRange(&size);
      if (slice.axis_ == 0) {
        pSVar3 = ShapeConstraint::channelRange(this_00);
      }
      else if (slice.axis_ == 1) {
        pSVar3 = ShapeConstraint::heightRange(this_00);
      }
      else {
        if (slice.axis_ != 2) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar4,"Slice layer axis incorrect -- should be caught in validator.");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pSVar3 = ShapeConstraint::widthRange(this_00);
      }
      uVar6 = -(uint)slice.endindex_;
      if (0 < (int)(uint)slice.endindex_) {
        uVar6 = (uint)slice.endindex_;
      }
      size._minimum._isUnbound = (pSVar3->_minimum)._isUnbound;
      size._minimum._1_7_ = *(undefined7 *)&(pSVar3->_minimum).field_0x1;
      size._minimum._val = (pSVar3->_minimum)._val;
      size._maximum._isUnbound = (pSVar3->_maximum)._isUnbound;
      size._maximum._1_7_ = *(undefined7 *)&(pSVar3->_maximum).field_0x1;
      size._maximum._val = (pSVar3->_maximum)._val;
      uVar1 = -(uint)slice.startindex_;
      if ((int)(uint)slice.endindex_ < 1) {
        uVar1 = (uint)slice.startindex_;
      }
      iVar5 = uVar6 + 1 + uVar1;
      ShapeRange::operator-(&local_a0,&size,iVar5);
      ShapeRange::operator/(&local_80,&local_a0,(int)slice.stride_);
      ShapeRange::operator+(&outrange,&local_80,1);
      if (slice.axis_ == 0) {
        ShapeConstraint::updateChannelRange(this_01,&outrange);
        pSVar3 = ShapeConstraint::heightRange(this_00);
        ShapeConstraint::updateHeightRange(this_01,pSVar3);
        pSVar3 = ShapeConstraint::widthRange(this_00);
        ShapeConstraint::updateWidthRange(this_01,pSVar3);
        ShapeConstraint::lowerBoundChannel(this_00,(long)iVar5);
        pSVar3 = ShapeConstraint::heightRange(this_01);
        ShapeConstraint::updateHeightRange(this_00,pSVar3);
      }
      else {
        if (slice.axis_ != 1) {
          pSVar3 = ShapeConstraint::channelRange(this_00);
          ShapeConstraint::updateChannelRange(this_01,pSVar3);
          pSVar3 = ShapeConstraint::heightRange(this_00);
          ShapeConstraint::updateHeightRange(this_01,pSVar3);
          ShapeConstraint::updateWidthRange(this_01,&outrange);
          pSVar3 = ShapeConstraint::channelRange(this_01);
          ShapeConstraint::updateChannelRange(this_00,pSVar3);
          pSVar3 = ShapeConstraint::heightRange(this_01);
          ShapeConstraint::updateHeightRange(this_00,pSVar3);
          ShapeConstraint::lowerBoundWidth(this_00,(long)iVar5);
          goto LAB_002725de;
        }
        pSVar3 = ShapeConstraint::channelRange(this_00);
        ShapeConstraint::updateChannelRange(this_01,pSVar3);
        ShapeConstraint::updateHeightRange(this_01,&outrange);
        pSVar3 = ShapeConstraint::widthRange(this_00);
        ShapeConstraint::updateWidthRange(this_01,pSVar3);
        pSVar3 = ShapeConstraint::channelRange(this_01);
        ShapeConstraint::updateChannelRange(this_00,pSVar3);
        ShapeConstraint::lowerBoundHeight(this_00,(long)iVar5);
      }
      pSVar3 = ShapeConstraint::widthRange(this_01);
      ShapeConstraint::updateWidthRange(this_00,pSVar3);
      goto LAB_002725de;
    }
    uVar6 = -(uint)slice.startindex_;
  }
  iVar5 = (int)((uint)slice.endindex_ + ~(uint)slice.startindex_) / (int)slice.stride_ + 1;
  if (slice.axis_ == 2) {
    pSVar3 = ShapeConstraint::channelRange(this_00);
    ShapeConstraint::updateChannelRange(this_01,pSVar3);
    pSVar3 = ShapeConstraint::heightRange(this_00);
    ShapeConstraint::updateHeightRange(this_01,pSVar3);
    ShapeConstraint::setWidth(this_01,(long)iVar5);
    pSVar3 = ShapeConstraint::channelRange(this_01);
    ShapeConstraint::updateChannelRange(this_00,pSVar3);
    pSVar3 = ShapeConstraint::heightRange(this_01);
    ShapeConstraint::updateHeightRange(this_00,pSVar3);
    ShapeConstraint::lowerBoundWidth(this_00,(ulong)uVar6);
  }
  else {
    if (slice.axis_ == 1) {
      pSVar3 = ShapeConstraint::channelRange(this_00);
      ShapeConstraint::updateChannelRange(this_01,pSVar3);
      ShapeConstraint::setHeight(this_01,(long)iVar5);
      pSVar3 = ShapeConstraint::widthRange(this_00);
      ShapeConstraint::updateWidthRange(this_01,pSVar3);
      pSVar3 = ShapeConstraint::channelRange(this_01);
      ShapeConstraint::updateChannelRange(this_00,pSVar3);
      ShapeConstraint::lowerBoundHeight(this_00,(ulong)uVar6);
    }
    else {
      if (slice.axis_ != 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar4,"Slice layer axis incorrect -- should be caught in validator.");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      ShapeConstraint::setChannel(this_01,(long)iVar5);
      pSVar3 = ShapeConstraint::heightRange(this_00);
      ShapeConstraint::updateHeightRange(this_01,pSVar3);
      pSVar3 = ShapeConstraint::widthRange(this_00);
      ShapeConstraint::updateWidthRange(this_01,pSVar3);
      ShapeConstraint::lowerBoundChannel(this_00,(ulong)uVar6);
      pSVar3 = ShapeConstraint::heightRange(this_01);
      ShapeConstraint::updateHeightRange(this_00,pSVar3);
    }
    pSVar3 = ShapeConstraint::widthRange(this_01);
    ShapeConstraint::updateWidthRange(this_00,pSVar3);
  }
LAB_002725de:
  Specification::SliceLayerParams::~SliceLayerParams(&slice);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeSliceLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Slice layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Slice layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(inputShape.sequenceRange());
    outputShape.updateBatchRange(inputShape.batchRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());

    Specification::SliceLayerParams slice = specLayer.slice();
    int start = static_cast<int>(slice.startindex());
    int end = static_cast<int>(slice.endindex());
    int stride = static_cast<int>(slice.stride());
    auto axis = slice.axis();

    int outsize = 0;
    int inLowerBound = 0;
    bool fixedSize = false;

    if (start >= 0 && end > 0) {
        fixedSize = true;
        outsize = (end - 1 - start) / stride + 1;
        inLowerBound = end;
    }
    else if (start < 0 && end <= 0) {
        fixedSize = true;
        inLowerBound = -1*start;
        outsize = (-start - 1 + end) / stride + 1;
    }

    // TODO: add check that this size is possible from the input size

    if (fixedSize) {
        switch (axis) {
            case Specification::SliceLayerParams::CHANNEL_AXIS:
                outputShape.setChannel(static_cast<size_t>(outsize));
                outputShape.updateHeightRange(inputShape.heightRange());
                outputShape.updateWidthRange(inputShape.widthRange());

                inputShape.lowerBoundChannel(static_cast<size_t>(inLowerBound));
                inputShape.updateHeightRange(outputShape.heightRange());
                inputShape.updateWidthRange(outputShape.widthRange());

                break;
            case Specification::SliceLayerParams::HEIGHT_AXIS:
                outputShape.updateChannelRange(inputShape.channelRange());
                outputShape.setHeight(static_cast<size_t>(outsize));
                outputShape.updateWidthRange(inputShape.widthRange());

                inputShape.updateChannelRange(outputShape.channelRange());
                inputShape.lowerBoundHeight(static_cast<size_t>(inLowerBound));
                inputShape.updateWidthRange(outputShape.widthRange());

                break;
            case Specification::SliceLayerParams::WIDTH_AXIS:
                outputShape.updateChannelRange(inputShape.channelRange());
                outputShape.updateHeightRange(inputShape.heightRange());
                outputShape.setWidth(static_cast<size_t>(outsize));

                inputShape.updateChannelRange(outputShape.channelRange());
                inputShape.updateHeightRange(outputShape.heightRange());
                inputShape.lowerBoundWidth(static_cast<size_t>(inLowerBound));

                break;
            default:
                throw std::runtime_error("Slice layer axis incorrect -- should be caught in validator.");
                break;
        }
    }
    else {
        ShapeRange size;
        switch (axis) {
            case Specification::SliceLayerParams::CHANNEL_AXIS:
                size = inputShape.channelRange();
                break;
            case Specification::SliceLayerParams::HEIGHT_AXIS:
                size = inputShape.heightRange();
                break;
            case Specification::SliceLayerParams::WIDTH_AXIS:
                size = inputShape.widthRange();
                break;
            default:
                throw std::runtime_error("Slice layer axis incorrect -- should be caught in validator.");
                break;
        }

        if (end <= 0) {
            end = (-1*end);
        }
        else { // start <=0, we already took the case where they have the same size
            start = (-1*start);
        }

        ShapeRange outrange = (size - (start + 1 + end)) / stride + 1;

        inLowerBound = start + 1 + end;

        switch (axis) {
            case Specification::SliceLayerParams::CHANNEL_AXIS: {
                outputShape.updateChannelRange(outrange);
                outputShape.updateHeightRange(inputShape.heightRange());
                outputShape.updateWidthRange(inputShape.widthRange());

                inputShape.lowerBoundChannel(static_cast<size_t>(inLowerBound));
                inputShape.updateHeightRange(outputShape.heightRange());
                inputShape.updateWidthRange(outputShape.widthRange());

                break;
            }
            case Specification::SliceLayerParams::HEIGHT_AXIS: {
                outputShape.updateChannelRange(inputShape.channelRange());
                outputShape.updateHeightRange(outrange);
                outputShape.updateWidthRange(inputShape.widthRange());

                inputShape.updateChannelRange(outputShape.channelRange());
                inputShape.lowerBoundHeight(static_cast<size_t>(inLowerBound));
                inputShape.updateWidthRange(outputShape.widthRange());

                break;
            }
            case Specification::SliceLayerParams::WIDTH_AXIS: {
                outputShape.updateChannelRange(inputShape.channelRange());
                outputShape.updateHeightRange(inputShape.heightRange());
                outputShape.updateWidthRange(outrange);

                inputShape.updateChannelRange(outputShape.channelRange());
                inputShape.updateHeightRange(outputShape.heightRange());
                inputShape.lowerBoundWidth(static_cast<size_t>(inLowerBound));

                break;
            }
            default: {
                throw std::runtime_error("Slice layer axis incorrect -- should be caught in validator.");
                break;
            }
        }

    } // signs don't match

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Slice layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Slice layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}